

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::SizeIsMatcher<int>::
Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>::
MatchAndExplain(Impl<const_google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage>_&>
                *this,RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *container,
               MatchResultListener *listener)

{
  ostream *poVar1;
  bool bVar2;
  MatchResultListener *this_00;
  SizeType size;
  StringMatchResultListener size_listener;
  int local_1ec;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1ec = (container->super_RepeatedPtrFieldBase).current_size_;
  local_1c8.stream_ = local_1a8;
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar2 = MatcherBase<int>::MatchAndExplain
                    (&(this->size_matcher_).super_MatcherBase<int>,&local_1ec,&local_1c8);
  this_00 = MatchResultListener::operator<<(listener,(char (*) [12])"whose size ");
  if (this_00->stream_ != (ostream *)0x0) {
    std::ostream::operator<<(this_00->stream_,local_1ec);
  }
  local_1e8 = (long *)0x10b9ced;
  if (bVar2) {
    local_1e8 = (long *)0x110d802;
  }
  MatchResultListener::operator<<(this_00,(char **)&local_1e8);
  std::__cxx11::stringbuf::str();
  poVar1 = listener->stream_;
  if ((poVar1 != (ostream *)0x0) && (local_1e0 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1e8,local_1e0);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar2;
}

Assistant:

bool MatchAndExplain(Container container,
                         MatchResultListener* listener) const override {
      SizeType size = container.size();
      StringMatchResultListener size_listener;
      const bool result = size_matcher_.MatchAndExplain(size, &size_listener);
      *listener << "whose size " << size
                << (result ? " matches" : " doesn't match");
      PrintIfNotEmpty(size_listener.str(), listener->stream());
      return result;
    }